

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O1

void TPZShapeH1<pzshape::TPZShapeCube>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int nod;
  long lVar5;
  ulong uVar6;
  TPZTransform<double> *this;
  int d_1;
  long lVar7;
  int d;
  int side;
  long lVar8;
  int xj;
  long lVar9;
  TPZFNMatrix<1,_double> auxmat;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> phin;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<81,_double> phiblend;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<81,_double> dphiblend;
  ulong local_16d0;
  long local_16a0;
  TPZFMatrix<double> local_1628;
  double adStack_1598 [2];
  TPZManVector<double,_3> local_1588;
  TPZFMatrix<double> local_1550;
  double adStack_14c0 [101];
  TPZFMatrix<double> local_1198;
  double local_1108 [101];
  TPZFMatrix<double> local_de0;
  double local_d50 [101];
  TPZFMatrix<double> local_a28;
  double local_998 [82];
  TPZFMatrix<double> local_708;
  double local_678 [101];
  TPZFMatrix<double> local_350;
  double local_2c0 [82];
  
  pzshape::TPZShapeCube::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 8) {
    local_a28.fElem = local_998;
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x1b;
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e3568;
    local_a28.fSize = 0x51;
    local_a28.fGiven = local_a28.fElem;
    TPZVec<int>::TPZVec(&local_a28.fPivot.super_TPZVec<int>,0);
    local_a28.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_a28.fPivot.super_TPZVec<int>.fStore = local_a28.fPivot.fExtAlloc;
    local_a28.fPivot.super_TPZVec<int>.fNElements = 0;
    local_a28.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_a28.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_a28.fWork.fStore = (double *)0x0;
    local_a28.fWork.fNElements = 0;
    local_a28.fWork.fNAlloc = 0;
    local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e3278;
    local_350.fElem = local_2c0;
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x1b;
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e3568;
    local_350.fSize = 0x51;
    local_350.fGiven = local_350.fElem;
    TPZVec<int>::TPZVec(&local_350.fPivot.super_TPZVec<int>,0);
    local_350.fPivot.super_TPZVec<int>.fStore = local_350.fPivot.fExtAlloc;
    local_350.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_350.fPivot.super_TPZVec<int>.fNElements = 0;
    local_350.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_350.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_350.fWork.fStore = (double *)0x0;
    local_350.fWork.fNElements = 0;
    local_350.fWork.fNAlloc = 0;
    local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e3278;
    lVar7 = 0;
    lVar5 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar5) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
         (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_a28.fElem[lVar5] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar5];
      lVar8 = 0;
      do {
        if (((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar8) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_350.fElem +
         lVar8 * 8 + local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7) =
             *(undefined8 *)
              ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
              lVar8 * 8 +
              (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow * lVar7);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 != 8);
    pzshape::TPZShapeCube::ShapeGenerating(pt,&local_a28,&local_350);
    local_16d0 = 8;
    lVar5 = 8;
    local_16a0 = 0x40;
    do {
      side = (int)lVar5;
      uVar1 = pzshape::TPZShapeCube::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -8]);
      if (uVar1 != 0) {
        if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(int)local_16d0;
        if ((((int)local_16d0 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar7)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7] = local_a28.fElem[lVar5];
        lVar8 = 0;
        do {
          if ((local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
             (local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow <= lVar8) || ((int)local_16d0 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem
          [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
           lVar7 + lVar8] =
               *(double *)
                ((long)local_350.fElem +
                lVar8 * 8 + local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16a0)
          ;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar2 = (int)local_16d0 + 1;
        local_16d0 = (ulong)uVar2;
        if (uVar1 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar5 + -8;
          iVar3 = pztopology::TPZCube::SideDimension(side);
          lVar7 = (long)(int)uVar1;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_1550.fSize = 100;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
          local_1550.fElem = adStack_14c0;
          local_1550.fGiven = adStack_14c0;
          TPZVec<int>::TPZVec(&local_1550.fPivot.super_TPZVec<int>,0);
          local_1550.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_1550.fPivot.super_TPZVec<int>.fStore = local_1550.fPivot.fExtAlloc;
          local_1550.fPivot.super_TPZVec<int>.fNElements = 0;
          local_1550.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_1550.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_1550.fWork.fStore = (double *)0x0;
          local_1550.fWork.fNElements = 0;
          local_1550.fWork.fNAlloc = 0;
          if (100 < (int)uVar1) {
            local_1550.fElem = (double *)operator_new__(lVar7 * 8);
          }
          local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          lVar8 = (long)iVar3;
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_1198.fSize = 100;
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_1198.fElem = local_1108;
          local_1198.fGiven = local_1108;
          TPZVec<int>::TPZVec(&local_1198.fPivot.super_TPZVec<int>,0);
          local_1198.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_1198.fPivot.super_TPZVec<int>.fStore = local_1198.fPivot.fExtAlloc;
          local_1198.fPivot.super_TPZVec<int>.fNElements = 0;
          local_1198.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_1198.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_1198.fWork.fStore = (double *)0x0;
          local_1198.fWork.fNElements = 0;
          local_1198.fWork.fNAlloc = 0;
          if (iVar3 == 0) {
            local_1198.fElem = (double *)0x0;
          }
          else {
            uVar4 = lVar8 * lVar7;
            if (100 < (long)uVar4) {
              uVar6 = uVar4 * 8;
              if (0x1fffffffffffffff < uVar4) {
                uVar6 = 0xffffffffffffffff;
              }
              local_1198.fElem = (double *)operator_new__(uVar6);
            }
          }
          local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_de0.fSize = 100;
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_de0.fElem = local_d50;
          local_de0.fGiven = local_d50;
          TPZVec<int>::TPZVec(&local_de0.fPivot.super_TPZVec<int>,0);
          local_de0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_de0.fPivot.super_TPZVec<int>.fStore = local_de0.fPivot.fExtAlloc;
          local_de0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_de0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_de0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_de0.fWork.fStore = (double *)0x0;
          local_de0.fWork.fNElements = 0;
          local_de0.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_de0.fElem = (double *)operator_new__(uVar4);
          }
          local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_708.fSize = 100;
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_708.fElem = local_678;
          local_708.fGiven = local_678;
          TPZVec<int>::TPZVec(&local_708.fPivot.super_TPZVec<int>,0);
          local_708.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_708.fPivot.super_TPZVec<int>.fStore = local_708.fPivot.fExtAlloc;
          local_708.fPivot.super_TPZVec<int>.fNElements = 0;
          local_708.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_708.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_708.fWork.fStore = (double *)0x0;
          local_708.fWork.fNElements = 0;
          local_708.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_708.fElem = (double *)operator_new__(uVar4);
          }
          local_708.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          TPZManVector<double,_3>::TPZManVector(&local_1588,lVar8);
          TPZTransform<double>::Apply(this,pt,&local_1588.super_TPZVec<double>);
          pzshape::TPZShapeCube::ShapeInternal
                    (side,&local_1588.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -8],&local_1550,
                     &local_1198);
          if (iVar3 < 3) {
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018e21e8;
            local_1628.fSize = 1;
            local_1628.fElem = adStack_1598;
            local_1628.fGiven = adStack_1598;
            TPZVec<int>::TPZVec(&local_1628.fPivot.super_TPZVec<int>,0);
            local_1628.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_1628.fPivot.super_TPZVec<int>.fStore = local_1628.fPivot.fExtAlloc;
            local_1628.fPivot.super_TPZVec<int>.fNElements = 0;
            local_1628.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_1628.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            local_1628.fWork.fStore = (double *)0x0;
            local_1628.fWork.fNElements = 0;
            local_1628.fWork.fNAlloc = 0;
            local_1628.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018e1ef8;
            TPZFMatrix<double>::operator=(&local_1628,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_1198,&local_1628,&local_de0,1);
            if (1 < (int)uVar1) {
              local_16d0 = (ulong)(int)uVar2;
              lVar7 = local_16d0 * 8;
              uVar4 = 1;
              lVar8 = 8;
              do {
                if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)local_16d0 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)local_16d0)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[local_16d0] =
                     local_a28.fElem[lVar5] * local_1550.fElem[uVar4];
                lVar9 = 0;
                do {
                  if ((local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4)
                     || (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                     (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_16d0 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)local_16d0)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  *(double *)
                   ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                   lVar9 * 8 +
                   (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * lVar7) =
                       *(double *)
                        ((long)local_350.fElem +
                        lVar9 * 8 +
                        local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16a0) *
                       local_1550.fElem[uVar4] +
                       local_a28.fElem[lVar5] *
                       *(double *)
                        ((long)local_de0.fElem +
                        lVar9 * 8 +
                        local_de0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_16d0 = local_16d0 + 1;
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 8;
                lVar8 = lVar8 + 8;
              } while (uVar4 != uVar1);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_1628,&PTR_PTR_018e21b0);
          }
          else if (1 < (int)uVar1) {
            local_16d0 = (ulong)(int)uVar2;
            lVar7 = local_16d0 * 8;
            uVar4 = 1;
            lVar8 = 8;
            do {
              if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                 (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                 (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)local_16d0 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)local_16d0)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[local_16d0] =
                   local_a28.fElem[lVar5] * local_1550.fElem[uVar4];
              lVar9 = 0;
              do {
                if ((local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_1550.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_a28.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_16d0 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)local_16d0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                 lVar9 * 8 +
                 (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar7) =
                     *(double *)
                      ((long)local_350.fElem +
                      lVar9 * 8 +
                      local_350.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_16a0) *
                     local_1550.fElem[uVar4] +
                     local_a28.fElem[lVar5] *
                     *(double *)
                      ((long)local_1198.fElem +
                      lVar9 * 8 +
                      local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_16d0 = local_16d0 + 1;
              uVar4 = uVar4 + 1;
              lVar7 = lVar7 + 8;
              lVar8 = lVar8 + 8;
            } while (uVar4 != uVar1);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_1588);
          TPZFMatrix<double>::~TPZFMatrix(&local_708,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_de0,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_1198,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_1550,&PTR_PTR_0185f328);
        }
      }
      lVar5 = lVar5 + 1;
      local_16a0 = local_16a0 + 8;
    } while (lVar5 != 0x1b);
    TPZFMatrix<double>::~TPZFMatrix(&local_350,&PTR_PTR_018e3530);
    TPZFMatrix<double>::~TPZFMatrix(&local_a28,&PTR_PTR_018e3530);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}